

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_legacy_regex(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *__needle;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 *__n;
  undefined1 *__s1;
  undefined1 *puVar13;
  void *__s2;
  undefined1 *puVar14;
  int *piVar15;
  double *pdVar16;
  long *plVar17;
  undefined8 extraout_RAX;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  char *unaff_RBX;
  int *piVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  char *unaff_R12;
  undefined **ppuVar25;
  char *pcVar26;
  long lVar27;
  undefined **ppuVar28;
  int *unaff_R15;
  int *piVar29;
  double dVar30;
  int extraout_XMM0_Db;
  char *flags;
  char *pattern;
  bson_t b;
  bson_error_t error;
  code **ppcVar31;
  undefined4 uStack_5fdc;
  undefined8 uStack_5fd8;
  undefined2 uStack_5fd0;
  int iStack_5fc8;
  int iStack_5fc4;
  char acStack_5fc0 [504];
  code *pcStack_5dc8;
  undefined1 auStack_5db8 [512];
  char *pcStack_5bb8;
  code *pcStack_5bb0;
  int iStack_5ba0;
  int iStack_5b9c;
  char acStack_5b98 [504];
  long *plStack_59a0;
  double *pdStack_5998;
  char *pcStack_5990;
  code *pcStack_5988;
  long lStack_5910;
  long lStack_5908;
  undefined1 auStack_5900 [128];
  undefined1 auStack_5880 [232];
  undefined1 auStack_5798 [608];
  long *plStack_5538;
  code *pcStack_5530;
  undefined1 auStack_5528 [8];
  char acStack_5520 [16];
  char *pcStack_5510;
  code *pcStack_5508;
  uint uStack_5484;
  undefined8 uStack_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 uStack_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 uStack_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 uStack_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined1 auStack_53b8 [648];
  int *piStack_5130;
  double *pdStack_5128;
  undefined **ppuStack_5120;
  int *piStack_5118;
  int *piStack_5110;
  code *pcStack_5108;
  undefined1 auStack_5100 [240];
  undefined1 auStack_5010 [648];
  code *apcStack_4d88 [16];
  double dStack_4d08;
  int aiStack_4d00 [50];
  int iStack_4c38;
  int iStack_4c34;
  int aiStack_4c30 [160];
  int *piStack_49b0;
  double *pdStack_49a8;
  undefined **ppuStack_49a0;
  int *piStack_4998;
  int *piStack_4990;
  code *apcStack_4988 [16];
  double dStack_4908;
  int aiStack_4900 [50];
  int iStack_4838;
  int iStack_4834;
  int aiStack_4830 [160];
  undefined8 uStack_45b0;
  undefined1 *puStack_45a8;
  char *pcStack_45a0;
  char *pcStack_4598;
  undefined **ppuStack_4590;
  code *pcStack_4588;
  int iStack_4580;
  int iStack_457c;
  char acStack_4578 [504];
  undefined1 auStack_4380 [336];
  char *pcStack_4230;
  undefined1 *puStack_4228;
  undefined1 *puStack_4220;
  void *pvStack_4218;
  void *pvStack_4210;
  code *pcStack_4208;
  undefined1 auStack_4200 [128];
  char acStack_4180 [232];
  undefined1 auStack_4098 [648];
  char *pcStack_3e10;
  code *pcStack_3e08;
  undefined1 auStack_3e00 [128];
  char acStack_3d80 [224];
  int iStack_3ca0;
  int iStack_3c9c;
  char acStack_3c98 [640];
  char *pcStack_3a18;
  void *pvStack_3a10;
  code *pcStack_3a08;
  undefined1 auStack_3a00 [128];
  char acStack_3980 [232];
  undefined1 auStack_3898 [648];
  char *pcStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [232];
  int iStack_3518;
  int iStack_3514;
  char acStack_3510 [640];
  char *pcStack_3290;
  code *apcStack_3288 [16];
  uint uStack_3204;
  undefined1 auStack_3200 [4];
  uint uStack_31fc;
  undefined1 auStack_3138 [648];
  undefined1 *puStack_2eb0;
  undefined1 *puStack_2ea8;
  undefined1 *puStack_2ea0;
  void *pvStack_2e98;
  void *pvStack_2e90;
  code *apcStack_2e88 [2];
  void *pvStack_2e78;
  char *pcStack_2e70;
  void *pvStack_2e68;
  char *pcStack_2e60;
  void *pvStack_2e58;
  char *pcStack_2e50;
  undefined1 *puStack_2e48;
  char *pcStack_2e40;
  undefined1 *puStack_2e38;
  char *pcStack_2e30;
  undefined8 uStack_2e28;
  char *pcStack_2e20;
  undefined8 uStack_2e18;
  char *pcStack_2e10;
  undefined8 uStack_2e08;
  undefined1 auStack_2e00 [4];
  uint uStack_2dfc;
  undefined1 auStack_2d38 [592];
  undefined8 uStack_2ae8;
  char *pcStack_2ae0;
  char *pcStack_2ad8;
  char *pcStack_2ad0;
  char *pcStack_2ac8;
  char *pcStack_2ac0;
  char *pcStack_2ab8;
  char *pcStack_2ab0;
  char *pcStack_2aa8;
  char *pcStack_2aa0;
  char *pcStack_2a98;
  char *pcStack_2a90;
  code *apcStack_2a88 [7];
  void *pvStack_2a50;
  undefined8 uStack_2a48;
  char *pcStack_2a40;
  void *pvStack_2a38;
  char *pcStack_2a30;
  undefined8 uStack_2a28;
  char *pcStack_2a20;
  void *pvStack_2a18;
  char *pcStack_2a10;
  undefined8 uStack_2a08;
  char acStack_2a00 [4];
  uint uStack_29fc;
  undefined1 auStack_2938 [648];
  undefined **ppuStack_26b0;
  char *pcStack_26a8;
  long lStack_26a0;
  undefined1 *puStack_2698;
  undefined1 *puStack_2690;
  code *pcStack_2688;
  int iStack_2680;
  int iStack_267c;
  char acStack_2678 [504];
  undefined1 auStack_2480 [168];
  undefined8 uStack_23d8;
  long lStack_23d0;
  undefined8 uStack_23c8;
  undefined8 uStack_23c0;
  char *pcStack_23b8;
  char *pcStack_23b0;
  char *pcStack_23a8;
  char *pcStack_23a0;
  char *pcStack_2398;
  long lStack_2390;
  undefined8 uStack_2388;
  char *pcStack_2380;
  char *pcStack_2378;
  char *pcStack_2370;
  char *pcStack_2368;
  long lStack_2360;
  char *pcStack_2358;
  char *pcStack_2350;
  char *pcStack_2348;
  char *pcStack_2340;
  char *pcStack_2338;
  char *pcStack_2330;
  char *pcStack_2328;
  char *pcStack_2320;
  char *pcStack_2318;
  char *pcStack_2310;
  code *apcStack_2308 [12];
  char *pcStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 uStack_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 uStack_2240;
  undefined8 uStack_2238;
  char *apcStack_2230 [22];
  char acStack_2180 [4];
  uint uStack_217c;
  undefined1 auStack_20b8 [648];
  char *pcStack_1e30;
  undefined **ppuStack_1e28;
  int **ppiStack_1e20;
  char *pcStack_1e18;
  int *piStack_1e10;
  code *pcStack_1e08;
  undefined1 auStack_1e00 [128];
  undefined1 auStack_1d80 [240];
  undefined1 auStack_1c90 [648];
  code *pcStack_1a08;
  undefined1 auStack_1a00 [128];
  char acStack_1980 [232];
  int iStack_1898;
  int iStack_1894;
  char acStack_1890 [632];
  char *pcStack_1618;
  code *apcStack_1610 [2];
  int iStack_1600;
  int iStack_15fc;
  undefined8 uStack_1428;
  char *pcStack_1420;
  undefined8 uStack_1418;
  int *piStack_1410;
  code *pcStack_1408;
  int iStack_1384;
  int aiStack_1380 [46];
  undefined8 uStack_12c8;
  int *piStack_12c0;
  char acStack_12b4 [12];
  undefined1 auStack_12a8 [648];
  char *pcStack_1020;
  char *pcStack_1018;
  int *piStack_1010;
  code *apcStack_1008 [15];
  int iStack_f90;
  int iStack_f8c;
  int *piStack_f88;
  char acStack_f80 [200];
  undefined1 auStack_eb8 [648];
  char *pcStack_c30;
  char *pcStack_c28;
  code *apcStack_c08 [14];
  int iStack_b94;
  char *pcStack_b90;
  int iStack_b84;
  char acStack_b80 [208];
  int iStack_ab0;
  int iStack_aac;
  char acStack_aa8 [640];
  char *pcStack_828;
  code *pcStack_808;
  undefined8 uStack_800;
  char *pcStack_790;
  undefined1 auStack_788 [8];
  undefined1 auStack_780 [224];
  undefined1 auStack_6a0 [648];
  char *pcStack_418;
  code *pcStack_408;
  undefined8 local_400;
  char *local_390;
  char *local_388;
  char local_380 [232];
  int local_298;
  int local_294;
  char local_290 [640];
  
  pcStack_408 = (code *)0x12ffa9;
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                              0xffffffffffffffff,&local_298);
  if (cVar1 == '\0') {
LAB_0013010d:
    pcStack_408 = (code *)0x13011a;
    test_bson_json_read_legacy_regex_cold_1();
LAB_0013011a:
    pcStack_408 = (code *)0x13011f;
    test_bson_json_read_legacy_regex_cold_4();
LAB_0013011f:
    pcStack_408 = (code *)0x130124;
    test_bson_json_read_legacy_regex_cold_5();
LAB_00130124:
    pcStack_408 = (code *)0x13012c;
    test_bson_json_read_legacy_regex_cold_10();
LAB_0013012c:
    pcStack_408 = (code *)0x130131;
    test_bson_json_read_legacy_regex_cold_6();
LAB_00130131:
    pcStack_408 = (code *)0x130136;
    test_bson_json_read_legacy_regex_cold_7();
LAB_00130136:
    pcStack_408 = (code *)0x13013e;
    test_bson_json_read_legacy_regex_cold_8();
LAB_0013013e:
    pcStack_408 = (code *)0x130146;
    test_bson_json_read_legacy_regex_cold_2();
  }
  else {
    pcStack_408 = (code *)0x12ffb6;
    uVar5 = bson_bcone_magic();
    local_400 = 0;
    pcStack_408 = (code *)0x12ffe9;
    bcon_extract(local_380,"a",uVar5,10,&local_388,&local_390);
    if (local_388 != "abc") {
      pcStack_408 = (code *)0x130007;
      iVar2 = strcmp(local_388,"abc");
      unaff_RBX = local_388;
      if (iVar2 == 0) goto LAB_0013000f;
      goto LAB_0013013e;
    }
LAB_0013000f:
    if (local_390 == "ix") {
LAB_00130037:
      unaff_RBX = local_380;
      pcStack_408 = (code *)0x130047;
      bson_destroy(unaff_RBX);
      pcStack_408 = (code *)0x130065;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff,
                                  &local_298);
      if (cVar1 != '\0') {
        pcStack_408 = (code *)0x130108;
        test_bson_json_read_legacy_regex_cold_11();
LAB_00130108:
        pcStack_408 = (code *)0x13010d;
        test_bson_json_read_legacy_regex_cold_9();
        goto LAB_0013010d;
      }
      if (local_298 != 1) goto LAB_0013011a;
      if (local_294 != 2) goto LAB_0013011f;
      unaff_RBX = local_290;
      pcStack_408 = (code *)0x1300a4;
      pcVar6 = strstr(unaff_RBX,"Missing \"$options\" after \"$regex\"");
      if (pcVar6 == (char *)0x0) goto LAB_00130124;
      pcStack_408 = (code *)0x1300cc;
      cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$options\": \"ix\"}}",0xffffffffffffffff,
                                  &local_298);
      if (cVar1 != '\0') goto LAB_00130108;
      if (local_298 != 1) goto LAB_0013012c;
      if (local_294 != 2) goto LAB_00130131;
      pcStack_408 = (code *)0x1300f7;
      pcVar6 = strstr(unaff_RBX,"Missing \"$regex\" after \"$options\"");
      if (pcVar6 != (char *)0x0) {
        return;
      }
      goto LAB_00130136;
    }
    pcStack_408 = (code *)0x13002f;
    iVar2 = strcmp(local_390,"ix");
    unaff_RBX = local_390;
    if (iVar2 == 0) goto LAB_00130037;
  }
  pcStack_408 = test_bson_json_read_regex_options_order;
  test_bson_json_read_legacy_regex_cold_3();
  pcStack_808 = (code *)0x130183;
  pcStack_418 = unaff_RBX;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                              0xffffffffffffffff,auStack_6a0);
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x130296;
    test_bson_json_read_regex_options_order_cold_1();
LAB_00130296:
    pcStack_808 = (code *)0x1302a3;
    test_bson_json_read_regex_options_order_cold_3();
LAB_001302a3:
    pcStack_808 = (code *)0x1302ab;
    test_bson_json_read_regex_options_order_cold_2();
  }
  else {
    pcStack_808 = (code *)0x130190;
    unaff_RBX = (char *)bson_bcone_magic();
    uStack_800 = 0;
    pcStack_808 = (code *)0x1301c6;
    bcon_extract(auStack_780,"a",unaff_RBX,10,auStack_788,&pcStack_790);
    if (pcStack_790 != "ims") {
      pcStack_808 = (code *)0x1301e4;
      iVar2 = strcmp(pcStack_790,"ims");
      if (iVar2 == 0) goto LAB_001301ec;
      goto LAB_001302a3;
    }
LAB_001301ec:
    pcStack_808 = (code *)0x1301fc;
    bson_destroy(auStack_780);
    pcStack_808 = (code *)0x13021a;
    cVar1 = bson_init_from_json(auStack_780,"{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                0xffffffffffffffff,auStack_6a0);
    if (cVar1 == '\0') goto LAB_00130296;
    uStack_800 = 0;
    pcStack_808 = (code *)0x130251;
    bcon_extract(auStack_780,"a",unaff_RBX,10,auStack_788,&pcStack_790);
    if (pcStack_790 == "ilms") {
LAB_00130273:
      pcStack_808 = (code *)0x130280;
      bson_destroy(auStack_780);
      return;
    }
    pcStack_808 = (code *)0x13026f;
    iVar2 = strcmp(pcStack_790,"ilms");
    unaff_RBX = pcStack_790;
    if (iVar2 == 0) goto LAB_00130273;
  }
  pcStack_808 = test_bson_json_read_binary;
  test_bson_json_read_regex_options_order_cold_4();
  apcStack_c08[0] = (code *)0x1302ec;
  pcStack_828 = unaff_RBX;
  pcStack_808 = (code *)&pcStack_408;
  cVar1 = bson_init_from_json(acStack_b80,
                              "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
                              0xffffffffffffffff,&iStack_ab0);
  if (cVar1 == '\0') {
LAB_001304f8:
    apcStack_c08[0] = (code *)0x130505;
    test_bson_json_read_binary_cold_1();
LAB_00130505:
    apcStack_c08[0] = (code *)0x13050a;
    test_bson_json_read_binary_cold_2();
LAB_0013050a:
    apcStack_c08[0] = (code *)0x13050f;
    test_bson_json_read_binary_cold_3();
LAB_0013050f:
    apcStack_c08[0] = (code *)0x13051c;
    test_bson_json_read_binary_cold_5();
LAB_0013051c:
    apcStack_c08[0] = (code *)0x130521;
    test_bson_json_read_binary_cold_6();
LAB_00130521:
    apcStack_c08[0] = (code *)0x130526;
    test_bson_json_read_binary_cold_7();
LAB_00130526:
    apcStack_c08[0] = (code *)0x13052b;
    test_bson_json_read_binary_cold_9();
LAB_0013052b:
    apcStack_c08[0] = (code *)0x130530;
    test_bson_json_read_binary_cold_10();
LAB_00130530:
    apcStack_c08[0] = (code *)0x130538;
    test_bson_json_read_binary_cold_15();
LAB_00130538:
    apcStack_c08[0] = (code *)0x13053d;
    test_bson_json_read_binary_cold_11();
LAB_0013053d:
    apcStack_c08[0] = (code *)0x130542;
    test_bson_json_read_binary_cold_12();
LAB_00130542:
    apcStack_c08[0] = (code *)0x13054a;
    test_bson_json_read_binary_cold_13();
LAB_0013054a:
    apcStack_c08[0] = (code *)0x130552;
    test_bson_json_read_binary_cold_4();
  }
  else {
    apcStack_c08[0] = (code *)0x1302f9;
    unaff_RBX = (char *)bson_bcone_magic();
    unaff_R15 = &iStack_b94;
    apcStack_c08[0] = (code *)0x0;
    bcon_extract(acStack_b80,"b",unaff_RBX,4,&iStack_b84,&pcStack_b90);
    if (iStack_b84 != 5) goto LAB_00130505;
    if (iStack_b94 != 3) goto LAB_0013050a;
    unaff_R12 = "foo";
    if (pcStack_b90 != "foo") {
      apcStack_c08[0] = (code *)0x13036d;
      iVar2 = strcmp(pcStack_b90,"foo");
      if (iVar2 == 0) goto LAB_00130375;
      goto LAB_0013054a;
    }
LAB_00130375:
    apcStack_c08[0] = (code *)0x130385;
    bson_destroy(acStack_b80);
    apcStack_c08[0] = (code *)0x1303a3;
    cVar1 = bson_init_from_json(acStack_b80,
                                "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                ,0xffffffffffffffff,&iStack_ab0);
    if (cVar1 == '\0') goto LAB_0013050f;
    apcStack_c08[0] = (code *)0x0;
    bcon_extract(acStack_b80,"b",unaff_RBX,4,&iStack_b84,&pcStack_b90);
    if (iStack_b84 != 5) goto LAB_0013051c;
    if (iStack_b94 != 3) goto LAB_00130521;
    if (pcStack_b90 == "foo") {
LAB_00130418:
      unaff_RBX = acStack_b80;
      apcStack_c08[0] = (code *)0x130428;
      bson_destroy(unaff_RBX);
      apcStack_c08[0] = (code *)0x130446;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                  0xffffffffffffffff,&iStack_ab0);
      if (cVar1 != '\0') {
        apcStack_c08[0] = (code *)0x1304f3;
        test_bson_json_read_binary_cold_16();
LAB_001304f3:
        apcStack_c08[0] = (code *)0x1304f8;
        test_bson_json_read_binary_cold_14();
        goto LAB_001304f8;
      }
      if (iStack_ab0 != 1) goto LAB_00130526;
      if (iStack_aac != 2) goto LAB_0013052b;
      unaff_RBX = acStack_aa8;
      apcStack_c08[0] = (code *)0x130485;
      pcVar6 = strstr(unaff_RBX,"Missing \"base64\" after \"subType\"");
      if (pcVar6 == (char *)0x0) goto LAB_00130530;
      apcStack_c08[0] = (code *)0x1304b1;
      cVar1 = bson_init_from_json(acStack_b80,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                  0xffffffffffffffff,&iStack_ab0);
      if (cVar1 != '\0') goto LAB_001304f3;
      if (iStack_ab0 != 1) goto LAB_00130538;
      if (iStack_aac != 2) goto LAB_0013053d;
      apcStack_c08[0] = (code *)0x1304dc;
      pcVar6 = strstr(unaff_RBX,"Missing \"subType\" after \"base64\"");
      if (pcVar6 != (char *)0x0) {
        return;
      }
      goto LAB_00130542;
    }
    apcStack_c08[0] = (code *)0x130410;
    iVar2 = strcmp(pcStack_b90,"foo");
    unaff_RBX = pcStack_b90;
    if (iVar2 == 0) goto LAB_00130418;
  }
  apcStack_c08[0] = test_bson_json_read_legacy_binary;
  test_bson_json_read_binary_cold_8();
  pcVar22 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar25 = &PTR_anon_var_dwarf_1a81d_00161258;
  pcVar6 = "foo";
  pcStack_c30 = unaff_RBX;
  pcStack_c28 = unaff_R12;
  apcStack_c08[0] = (code *)&pcStack_808;
  while( true ) {
    apcStack_1008[0] = (code *)0x1305ab;
    cVar1 = bson_init_from_json(acStack_f80,pcVar22,0xffffffffffffffff,auStack_eb8);
    if (cVar1 == '\0') break;
    apcStack_1008[0] = (code *)0x1305b8;
    uVar5 = bson_bcone_magic();
    apcStack_1008[0] = (code *)0x0;
    piStack_1010 = &iStack_f90;
    pcStack_1018 = (char *)0x1305e2;
    bcon_extract(acStack_f80,"x",uVar5,4,&iStack_f8c,&piStack_f88);
    if (iStack_f8c != 5) {
LAB_0013063e:
      apcStack_1008[0] = (code *)0x130643;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (iStack_f90 != 3) {
      apcStack_1008[0] = (code *)0x13063e;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_0013063e;
    }
    unaff_R15 = piStack_f88;
    if (piStack_f88 != (int *)"foo") {
      apcStack_1008[0] = (code *)0x13060d;
      iVar2 = strcmp((char *)piStack_f88,"foo");
      if (iVar2 == 0) goto LAB_00130611;
      goto LAB_00130650;
    }
LAB_00130611:
    apcStack_1008[0] = (code *)0x130619;
    bson_destroy(acStack_f80);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
  apcStack_1008[0] = (code *)0x130650;
  test_bson_json_read_legacy_binary_cold_1();
LAB_00130650:
  apcStack_1008[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_1018 = "foo";
  aiStack_1380[0x1c] = 0;
  aiStack_1380[0x1d] = 0;
  aiStack_1380[0x1e] = 0;
  aiStack_1380[0x1f] = 0;
  aiStack_1380[0x18] = 0;
  aiStack_1380[0x19] = 0;
  aiStack_1380[0x1a] = 0;
  aiStack_1380[0x1b] = 0;
  aiStack_1380[0x14] = 0;
  aiStack_1380[0x15] = 0;
  aiStack_1380[0x16] = 0;
  aiStack_1380[0x17] = 0;
  aiStack_1380[0x10] = 0;
  aiStack_1380[0x11] = 0;
  aiStack_1380[0x12] = 0;
  aiStack_1380[0x13] = 0;
  aiStack_1380[0xc] = 0;
  aiStack_1380[0xd] = 0;
  aiStack_1380[0xe] = 0;
  aiStack_1380[0xf] = 0;
  aiStack_1380[8] = 0;
  aiStack_1380[9] = 0;
  aiStack_1380[10] = 0;
  aiStack_1380[0xb] = 0;
  aiStack_1380[4] = 0;
  aiStack_1380[5] = 0;
  aiStack_1380[6] = 0;
  aiStack_1380[7] = 0;
  aiStack_1380[0] = 3;
  aiStack_1380[1] = 5;
  aiStack_1380[2] = 5;
  aiStack_1380[3] = 0;
  pcStack_1408 = (code *)0x1306dd;
  pcStack_1020 = acStack_f80;
  piStack_1010 = unaff_R15;
  apcStack_1008[0] = (code *)apcStack_c08;
  pcVar22 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_12a8);
  if (pcVar22 == (char *)0x0) {
    pcStack_1408 = (code *)0x130826;
    test_json_reader_new_from_file_cold_6();
    pcVar22 = acStack_f80;
LAB_00130826:
    pcStack_1408 = (code *)0x13082b;
    test_json_reader_new_from_file_cold_5();
LAB_0013082b:
    pcStack_1408 = (code *)0x130843;
    test_json_reader_new_from_file_cold_1();
LAB_00130843:
    pcStack_1408 = (code *)0x130848;
    test_json_reader_new_from_file_cold_3();
LAB_00130848:
    pcStack_1408 = (code *)0x130860;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_1408 = (code *)0x130701;
    iVar2 = bson_json_reader_read(pcVar22,aiStack_1380,auStack_12a8);
    if (iVar2 != 1) goto LAB_0013082b;
    pcStack_1408 = (code *)0x13070f;
    pcVar6 = (char *)bson_bcone_magic();
    piStack_1410 = &iStack_1384;
    pcStack_1408 = (code *)0x0;
    uStack_1418 = 0xf;
    uStack_1428 = 0x13074c;
    pcStack_1420 = pcVar6;
    bcon_extract(aiStack_1380,"foo",pcVar6,0,&piStack_12c0,"a");
    unaff_R15 = piStack_12c0;
    if (piStack_12c0 == (int *)0x1408f8) {
LAB_00130776:
      if (iStack_1384 != 1) goto LAB_00130843;
      unaff_R15 = aiStack_1380;
      pcStack_1408 = (code *)0x130793;
      bson_reinit(unaff_R15);
      pcStack_1408 = (code *)0x1307a6;
      iVar2 = bson_json_reader_read(pcVar22,unaff_R15,auStack_12a8);
      if (iVar2 == 1) {
        unaff_R15 = (int *)&uStack_12c8;
        pcStack_1408 = (code *)0x1307db;
        bcon_extract(aiStack_1380,"_id",pcVar6,6,unaff_R15,0);
        pcVar6 = acStack_12b4;
        pcStack_1408 = (code *)0x1307f2;
        bson_oid_init_from_string(pcVar6,"aabbccddeeff001122334455");
        pcStack_1408 = (code *)0x1307fd;
        cVar1 = bson_oid_equal(pcVar6,uStack_12c8);
        if (cVar1 != '\0') {
          pcStack_1408 = (code *)0x13080e;
          bson_destroy(aiStack_1380);
          pcStack_1408 = (code *)0x130816;
          bson_json_reader_destroy(pcVar22);
          return;
        }
        goto LAB_00130826;
      }
      goto LAB_00130848;
    }
    pcStack_1408 = (code *)0x13076e;
    iVar2 = strcmp("bar",(char *)piStack_12c0);
    if (iVar2 == 0) goto LAB_00130776;
  }
  pcStack_1408 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_1610[0] = (code *)0x130880;
  lVar7 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_1600);
  if (lVar7 == 0) {
    if (iStack_1600 != 2) goto LAB_001308a4;
    if (iStack_15fc == 1) {
      return;
    }
  }
  else {
    apcStack_1610[0] = (code *)0x1308a4;
    test_json_reader_new_from_bad_path_cold_1();
LAB_001308a4:
    apcStack_1610[0] = (code *)0x1308a9;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_1610[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_1a08 = (code *)0x1308e1;
  pcStack_1618 = pcVar22;
  apcStack_1610[0] = (code *)apcStack_1008;
  cVar1 = bson_init_from_json(acStack_1980,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_1898);
  if (cVar1 == '\0') {
LAB_00130c76:
    pcStack_1a08 = (code *)0x130c83;
    test_bson_json_number_long_cold_1();
LAB_00130c83:
    pcStack_1a08 = (code *)0x130c90;
    test_bson_json_number_long_cold_6();
LAB_00130c90:
    pcStack_1a08 = (code *)0x130c98;
    test_bson_json_number_long_cold_9();
LAB_00130c98:
    pcStack_1a08 = (code *)0x130ca5;
    test_bson_json_number_long_cold_10();
LAB_00130ca5:
    pcStack_1a08 = (code *)0x130cad;
    test_bson_json_number_long_cold_13();
LAB_00130cad:
    pcStack_1a08 = (code *)0x130cb2;
    test_bson_json_number_long_cold_14();
LAB_00130cb2:
    pcStack_1a08 = (code *)0x130cb7;
    test_bson_json_number_long_cold_15();
LAB_00130cb7:
    pcStack_1a08 = (code *)0x130cbf;
    test_bson_json_number_long_cold_28();
LAB_00130cbf:
    pcStack_1a08 = (code *)0x130cc4;
    test_bson_json_number_long_cold_16();
LAB_00130cc4:
    pcStack_1a08 = (code *)0x130cc9;
    test_bson_json_number_long_cold_17();
LAB_00130cc9:
    pcStack_1a08 = (code *)0x130cd1;
    test_bson_json_number_long_cold_26();
LAB_00130cd1:
    pcStack_1a08 = (code *)0x130cd6;
    test_bson_json_number_long_cold_18();
LAB_00130cd6:
    pcStack_1a08 = (code *)0x130cdb;
    test_bson_json_number_long_cold_19();
LAB_00130cdb:
    pcStack_1a08 = (code *)0x130ce3;
    test_bson_json_number_long_cold_24();
LAB_00130ce3:
    pcStack_1a08 = (code *)0x130ce8;
    test_bson_json_number_long_cold_20();
LAB_00130ce8:
    pcStack_1a08 = (code *)0x130ced;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_1a08 = (code *)0x1308f9;
    cVar1 = bson_iter_init(auStack_1a00,acStack_1980);
    if (cVar1 == '\0') {
      pcStack_1a08 = (code *)0x130c35;
      test_bson_json_number_long_cold_2();
LAB_00130c35:
      pcStack_1a08 = (code *)0x130c3a;
      test_bson_json_number_long_cold_3();
LAB_00130c3a:
      pcStack_1a08 = (code *)0x130c3f;
      test_bson_json_number_long_cold_4();
LAB_00130c3f:
      pcStack_1a08 = (code *)0x130c44;
      test_bson_json_number_long_cold_5();
LAB_00130c44:
      pcStack_1a08 = (code *)0x130c49;
      test_bson_json_number_long_cold_31();
LAB_00130c49:
      pcStack_1a08 = (code *)0x130c4e;
      test_bson_json_number_long_cold_30();
LAB_00130c4e:
      pcStack_1a08 = (code *)0x130c53;
      test_bson_json_number_long_cold_7();
LAB_00130c53:
      pcStack_1a08 = (code *)0x130c58;
      test_bson_json_number_long_cold_8();
LAB_00130c58:
      pcStack_1a08 = (code *)0x130c5d;
      test_bson_json_number_long_cold_11();
LAB_00130c5d:
      pcStack_1a08 = (code *)0x130c62;
      test_bson_json_number_long_cold_12();
LAB_00130c62:
      pcStack_1a08 = (code *)0x130c67;
      test_bson_json_number_long_cold_29();
LAB_00130c67:
      pcStack_1a08 = (code *)0x130c6c;
      test_bson_json_number_long_cold_27();
LAB_00130c6c:
      pcStack_1a08 = (code *)0x130c71;
      test_bson_json_number_long_cold_25();
LAB_00130c71:
      pcStack_1a08 = (code *)0x130c76;
      test_bson_json_number_long_cold_23();
      goto LAB_00130c76;
    }
    pcStack_1a08 = (code *)0x130910;
    cVar1 = bson_iter_find(auStack_1a00,"key");
    if (cVar1 == '\0') goto LAB_00130c35;
    pcStack_1a08 = (code *)0x130920;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00130c3a;
    pcStack_1a08 = (code *)0x130931;
    lVar7 = bson_iter_int64(auStack_1a00);
    if (lVar7 != 0x4000000000000000) goto LAB_00130c3f;
    pcVar22 = acStack_1980;
    pcStack_1a08 = (code *)0x130954;
    bson_destroy(pcVar22);
    pcStack_1a08 = (code *)0x130972;
    cVar1 = bson_init_from_json(pcVar22,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c44;
    pcStack_1a08 = (code *)0x13099d;
    cVar1 = bson_init_from_json(acStack_1980,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c49;
    pcStack_1a08 = (code *)0x1309c8;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 == '\0') goto LAB_00130c83;
    pcStack_1a08 = (code *)0x1309e7;
    cVar1 = bson_iter_init_find(auStack_1a00,acStack_1980,"x");
    if (cVar1 == '\0') goto LAB_00130c4e;
    pcStack_1a08 = (code *)0x1309f7;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00130c53;
    pcVar22 = (char *)0x7fffffffffffffff;
    pcStack_1a08 = (code *)0x130a12;
    lVar7 = bson_iter_int64(auStack_1a00);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00130c90;
    pcStack_1a08 = (code *)0x130a3e;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 == '\0') goto LAB_00130c98;
    pcStack_1a08 = (code *)0x130a5d;
    cVar1 = bson_iter_init_find(auStack_1a00,acStack_1980,"x");
    if (cVar1 == '\0') goto LAB_00130c58;
    pcStack_1a08 = (code *)0x130a6d;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00130c5d;
    pcStack_1a08 = (code *)0x130a7e;
    lVar7 = bson_iter_int64(auStack_1a00);
    pcVar22 = (char *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_00130ca5;
    pcVar22 = acStack_1980;
    pcStack_1a08 = (code *)0x130a9a;
    bson_destroy(pcVar22);
    pcStack_1a08 = (code *)0x130ab8;
    cVar1 = bson_init_from_json(pcVar22,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c62;
    if (iStack_1898 != 1) goto LAB_00130cad;
    if (iStack_1894 != 2) goto LAB_00130cb2;
    pcVar22 = acStack_1890;
    pcStack_1a08 = (code *)0x130af7;
    pcVar8 = strstr(pcVar22,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cb7;
    pcStack_1a08 = (code *)0x130b23;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c67;
    if (iStack_1898 != 1) goto LAB_00130cbf;
    if (iStack_1894 != 2) goto LAB_00130cc4;
    pcStack_1a08 = (code *)0x130b5a;
    pcVar8 = strstr(pcVar22,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cc9;
    pcStack_1a08 = (code *)0x130b86;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c6c;
    if (iStack_1898 != 1) goto LAB_00130cd1;
    if (iStack_1894 != 2) goto LAB_00130cd6;
    pcStack_1a08 = (code *)0x130bbd;
    pcVar8 = strstr(pcVar22,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cdb;
    pcStack_1a08 = (code *)0x130be9;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_1898);
    if (cVar1 != '\0') goto LAB_00130c71;
    if (iStack_1898 != 1) goto LAB_00130ce3;
    if (iStack_1894 != 2) goto LAB_00130ce8;
    pcStack_1a08 = (code *)0x130c20;
    pcVar8 = strstr(pcVar22,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_1a08 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1e08 = (code *)0x130d27;
  pcStack_1a08 = (code *)apcStack_1610;
  cVar1 = bson_init_from_json(auStack_1d80,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1c90);
  if (cVar1 != '\0') {
    pcStack_1e08 = (code *)0x130d3b;
    cVar1 = bson_iter_init(auStack_1e00,auStack_1d80);
    if (cVar1 == '\0') {
      pcStack_1e08 = (code *)0x130d83;
      test_bson_json_number_long_zero_cold_2();
LAB_00130d83:
      pcStack_1e08 = (code *)0x130d88;
      test_bson_json_number_long_zero_cold_3();
LAB_00130d88:
      pcStack_1e08 = (code *)0x130d8d;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1e08 = (code *)0x130d4e;
      cVar1 = bson_iter_find(auStack_1e00,"key");
      if (cVar1 == '\0') goto LAB_00130d83;
      pcStack_1e08 = (code *)0x130d5a;
      iVar2 = bson_iter_type(auStack_1e00);
      if (iVar2 != 0x12) goto LAB_00130d88;
      pcStack_1e08 = (code *)0x130d67;
      lVar7 = bson_iter_int64(auStack_1e00);
      if (lVar7 == 0) {
        pcStack_1e08 = (code *)0x130d79;
        bson_destroy(auStack_1d80);
        return;
      }
    }
    pcStack_1e08 = (code *)0x130d92;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1e08 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_2308[0] = (code *)0x130dbc;
  pcStack_1e30 = pcVar22;
  ppuStack_1e28 = ppuVar25;
  ppiStack_1e20 = &piStack_f88;
  pcStack_1e18 = pcVar6;
  piStack_1e10 = unaff_R15;
  pcStack_1e08 = (code *)&pcStack_1a08;
  lVar7 = bson_bcon_magic();
  apcStack_2308[0] = (code *)0x130de7;
  pcStack_22a8 = (char *)bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_2308[0] = (code *)0x130e0a;
  uStack_2238 = bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_2308[0] = (code *)0x130e33;
  uVar5 = bcon_new(0,"var",lVar7,0xf,1,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x130e59;
  uStack_2240 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  apcStack_2308[0] = (code *)0x130e86;
  uVar9 = bcon_new(0,"var2",lVar7,0x11,2,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x130eac;
  uStack_2248 = bcon_new(0,"a",lVar7,0xe,"b",uVar9);
  apcStack_2308[0] = (code *)0x0;
  pcStack_2318 = "d";
  pcStack_2320 = (char *)0xe;
  pcStack_2330 = "c";
  pcStack_2338 = (char *)0x130ef6;
  pcStack_2328 = (char *)lVar7;
  pcStack_2310 = (char *)uVar9;
  uStack_2280 = uVar9;
  uStack_2250 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = "}";
  pcStack_2320 = "}";
  pcStack_2328 = "value2";
  pcStack_2330 = (char *)0x0;
  pcStack_2340 = "key2";
  pcStack_2348 = "{";
  pcStack_2350 = "subdoc";
  pcStack_2358 = "value";
  lStack_2360 = 0;
  pcStack_2370 = "key1";
  pcStack_2378 = "{";
  pcStack_2380 = "c";
  uStack_2388 = 0x130f7a;
  pcStack_2368 = (char *)lVar7;
  pcStack_2338 = (char *)lVar7;
  uStack_2258 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x130fbe;
  uStack_2278 = uVar5;
  uStack_2260 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  apcStack_2308[0] = (code *)0x130fe7;
  uStack_2288 = bcon_new(0,"var","{","}",0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x13100f;
  uStack_2268 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2288);
  apcStack_2308[0] = (code *)0x0;
  pcStack_2310 = "}";
  pcStack_2318 = "}";
  pcStack_2320 = (char *)0x3;
  pcStack_2328 = (char *)0xf;
  pcStack_2338 = "z";
  pcStack_2340 = "{";
  pcStack_2348 = "d3";
  pcStack_2350 = (char *)0x1;
  pcStack_2358 = (char *)0xf;
  pcStack_2368 = "x";
  pcStack_2370 = "{";
  pcStack_2378 = "d2";
  pcStack_2380 = (char *)0x1;
  uStack_2388 = 0x11;
  pcStack_2398 = "n";
  pcStack_23a0 = "}";
  pcStack_23a8 = "{";
  pcStack_23b0 = "d";
  pcStack_23b8 = "]";
  uStack_23c0 = 2;
  uStack_23c8 = 0xf;
  uStack_23d8 = 0x1310bd;
  lStack_23d0 = lVar7;
  lStack_2390 = lVar7;
  lStack_2360 = lVar7;
  pcStack_2330 = (char *)lVar7;
  uStack_2290 = bcon_new(0,"arr","[",lVar7,0xf,1);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x1310f6;
  uStack_2270 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2290);
  apcStack_2308[0] = (code *)0x131107;
  uStack_2298 = bson_new();
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x13112f;
  pcVar22 = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_2298);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = "}";
  pcStack_2320 = "c";
  pcStack_2328 = (char *)0x131172;
  uStack_22a0 = bcon_new(0,"x","{","$code",lVar7,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x131197;
  apcStack_2230[0x15] = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_22a0);
  apcStack_2230[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_2230[1] = pcStack_22a8;
  apcStack_2230[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_2230[3] = (char *)uStack_2238;
  apcStack_2230[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_2230[5] = (char *)uStack_2240;
  apcStack_2230[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_2230[7] = (char *)uStack_2248;
  apcStack_2230[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_2230[9] = (char *)uStack_2258;
  apcStack_2230[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_2230[0xb] = (char *)uStack_2250;
  apcStack_2230[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_2230[0xd] = (char *)uStack_2260;
  apcStack_2230[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_2230[0xf] = (char *)uStack_2268;
  apcStack_2230[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_2230[0x11] = (char *)uStack_2270;
  apcStack_2230[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_2230[0x13] = pcVar22;
  apcStack_2230[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar26 = (char *)0x8;
  pcVar6 = acStack_2180;
  pcVar8 = "b";
  while( true ) {
    apcStack_2308[0] = (code *)0x13130a;
    cVar1 = bson_init_from_json(pcVar6,*(undefined8 *)((long)&uStack_2238 + (long)pcVar26),
                                0xffffffffffffffff,auStack_20b8);
    __needle = pcVar26;
    if (cVar1 == '\0') break;
    apcStack_2308[0] = (code *)0x13131d;
    pcStack_22a8 = (char *)bson_get_data(pcVar6);
    lVar7 = *(long *)((long)apcStack_2230 + (long)pcVar26);
    apcStack_2308[0] = (code *)0x131332;
    __needle = (char *)bson_get_data(lVar7);
    if (*(uint *)(lVar7 + 4) != uStack_217c) {
LAB_001313fc:
      apcStack_2308[0] = (code *)0x13140e;
      pcVar6 = (char *)bson_as_canonical_extended_json(acStack_2180);
      apcStack_2308[0] = (code *)0x13141b;
      uVar5 = bson_as_canonical_extended_json(lVar7);
      pcVar22 = pcStack_22a8;
      uVar20 = 0xffffffff;
      if (uStack_217c == 0) goto LAB_00131463;
      uVar23 = 0;
      goto LAB_00131448;
    }
    apcStack_2308[0] = (code *)0x13134e;
    pvVar10 = (void *)bson_get_data(lVar7);
    apcStack_2308[0] = (code *)0x131359;
    pvVar11 = (void *)bson_get_data(pcVar6);
    apcStack_2308[0] = (code *)0x131368;
    iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(lVar7 + 4));
    if (iVar2 != 0) goto LAB_001313fc;
    apcStack_2308[0] = (code *)0x13137b;
    bson_destroy(pcVar6);
    pcVar26 = pcVar26 + 0x10;
    pcVar8 = pcVar6;
    pcVar22 = __needle;
    if (pcVar26 == (char *)0xb8) {
      lVar7 = 8;
      do {
        apcStack_2308[0] = (code *)0x13139e;
        bson_destroy(*(undefined8 *)((long)apcStack_2230 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0xb8);
      apcStack_2308[0] = (code *)0x1313b8;
      bson_destroy(uStack_2278);
      apcStack_2308[0] = (code *)0x1313c5;
      bson_destroy(uStack_2280);
      apcStack_2308[0] = (code *)0x1313cf;
      bson_destroy(uStack_2288);
      apcStack_2308[0] = (code *)0x1313d9;
      bson_destroy(uStack_2290);
      apcStack_2308[0] = (code *)0x1313e3;
      bson_destroy(uStack_22a0);
      apcStack_2308[0] = (code *)0x1313ed;
      bson_destroy(uStack_2298);
      return;
    }
  }
  goto LAB_00131529;
  while( true ) {
    if (pcStack_22a8[uVar23] != __needle[uVar23]) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_217c == (uint)uVar23) break;
LAB_00131448:
    if (*(int *)(lVar7 + 4) == (int)uVar23) break;
  }
LAB_00131463:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_217c;
    if (uStack_217c < *(uint *)(lVar7 + 4)) {
      uVar3 = *(uint *)(lVar7 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_2308[0] = (code *)0x131494;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar6,uVar5);
  apcStack_2308[0] = (code *)0x1314ac;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar8 = (char *)(ulong)uVar3;
  apcStack_2308[0] = (code *)0x1314c6;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pcStack_22a8 = (char *)CONCAT44(pcStack_22a8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131515:
    apcStack_2308[0] = (code *)0x13151a;
    test_bson_json_code_cold_6();
LAB_0013151a:
    apcStack_2308[0] = (code *)0x13151f;
    test_bson_json_code_cold_5();
LAB_0013151f:
    apcStack_2308[0] = (code *)0x131524;
    test_bson_json_code_cold_2();
  }
  else {
    pcVar6 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013151a;
    pcVar8 = (char *)(ulong)uStack_217c;
    apcStack_2308[0] = (code *)0x1314ed;
    pcVar26 = (char *)write(uVar3,pcVar22,(size_t)pcVar8);
    if (pcVar26 != pcVar8) goto LAB_0013151f;
    pcVar8 = (char *)(ulong)*(uint *)(lVar7 + 4);
    apcStack_2308[0] = (code *)0x131504;
    pcVar26 = (char *)write(uVar4,__needle,(size_t)pcVar8);
    if (pcVar26 == pcVar8) {
      apcStack_2308[0] = (code *)0x131515;
      test_bson_json_code_cold_4();
      goto LAB_00131515;
    }
  }
  apcStack_2308[0] = (code *)0x131529;
  test_bson_json_code_cold_3();
LAB_00131529:
  apcStack_2308[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar27 = 8;
  pcStack_2330 = pcVar8;
  pcStack_2328 = __needle;
  pcStack_2320 = pcVar22;
  pcStack_2318 = pcVar6;
  pcStack_2310 = (char *)lVar7;
  apcStack_2308[0] = (code *)&pcStack_1e08;
  do {
    pcStack_2688 = (code *)0x13157d;
    cVar1 = bson_init_from_json(auStack_2480,*(undefined8 *)(&UNK_00161268 + lVar27),
                                0xffffffffffffffff,&iStack_2680);
    if (cVar1 != '\0') {
      pcStack_2688 = (code *)0x1315ca;
      test_bson_json_code_errors_cold_3();
LAB_001315ca:
      pcStack_2688 = (code *)0x1315cf;
      test_bson_json_code_errors_cold_2();
LAB_001315cf:
      pcStack_2688 = (code *)0x1315ef;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_2678,
              __needle);
      pcStack_2688 = (code *)0x1315f4;
      abort();
    }
    if (iStack_2680 != 1) {
      pcStack_2688 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_26b0 = &PTR_anon_var_dwarf_1ab4d_00161270;
      apcStack_2a88[0] = (code *)0x131616;
      pcStack_26a8 = __needle;
      lStack_26a0 = lVar27;
      puStack_2698 = auStack_2480;
      puStack_2690 = (undefined1 *)&iStack_2680;
      pcStack_2688 = (code *)apcStack_2308;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2a88[0] = (code *)0x131635;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar11 = (void *)0x0;
      pcVar22 = "$ref";
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = oid_zero_oid;
      pcStack_2aa8 = (char *)0x6;
      pcStack_2ab8 = "$id";
      pcStack_2ac0 = "collection";
      pcStack_2ac8 = (char *)0x131696;
      pcStack_2ab0 = (char *)uVar5;
      pvStack_2a50 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0xf;
      pcStack_2ab8 = "$id";
      pcStack_2ac0 = "collection";
      pcStack_2ac8 = (char *)0x1316e6;
      pcStack_2ab0 = (char *)uVar5;
      uStack_2a48 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_2a88[0] = (code *)0x0;
      pcStack_2a90 = "}";
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0xf;
      pcStack_2ab8 = "a";
      pcStack_2ac0 = "{";
      pcStack_2ac8 = "$id";
      pcStack_2ad0 = "collection";
      pcStack_2ad8 = (char *)0x13173e;
      pcStack_2ab0 = (char *)uVar5;
      pvVar10 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0x7;
      pcStack_2ab8 = "meta";
      pcStack_2ac0 = (char *)0x1;
      pcStack_2ac8 = (char *)0xf;
      pcStack_2ad8 = "$id";
      pcStack_2ae0 = "collection";
      uStack_2ae8 = 0x1317a1;
      pcStack_2ad0 = (char *)uVar5;
      pcStack_2ab0 = (char *)uVar5;
      uStack_2a08 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a40 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2a38 = pvStack_2a50;
      pcStack_2a30 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2a28 = uStack_2a48;
      pcStack_2a20 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2a18 = pvVar10;
      pcStack_2a10 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar6 = "key";
      break;
    }
    if (iStack_267c != 2) goto LAB_001315ca;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1ab4d_00161270 + lVar27);
    pcStack_2688 = (code *)0x1315a4;
    pcVar6 = strstr(acStack_2678,__needle);
    if (pcVar6 == (char *)0x0) goto LAB_001315cf;
    lVar27 = lVar27 + 0x10;
    if (lVar27 == 0x98) {
      return;
    }
  } while( true );
LAB_001317fb:
  apcStack_2a88[0] = (code *)0x131817;
  cVar1 = bson_init_from_json(acStack_2a00,*(undefined8 *)((long)&pcStack_2a40 + (long)pvVar11),
                              0xffffffffffffffff,auStack_2938);
  pcVar8 = acStack_2a00;
  pvVar12 = pvVar11;
  if (cVar1 == '\0') goto LAB_001319dd;
  apcStack_2a88[0] = (code *)0x13182a;
  pvStack_2a50 = (void *)bson_get_data(acStack_2a00);
  pcVar8 = *(char **)((long)&pvStack_2a38 + (long)pvVar11);
  apcStack_2a88[0] = (code *)0x13183c;
  pvVar12 = (void *)bson_get_data(pcVar8);
  if (*(uint *)(pcVar8 + 4) != uStack_29fc) {
LAB_001318b1:
    apcStack_2a88[0] = (code *)0x1318c3;
    pcVar22 = (char *)bson_as_canonical_extended_json(acStack_2a00);
    apcStack_2a88[0] = (code *)0x1318d0;
    uVar5 = bson_as_canonical_extended_json(pcVar8);
    pvVar10 = pvStack_2a50;
    uVar20 = 0xffffffff;
    if (uStack_29fc == 0) goto LAB_00131915;
    uVar23 = 0;
    goto LAB_001318fb;
  }
  apcStack_2a88[0] = (code *)0x131853;
  pcVar22 = (char *)bson_get_data(pcVar8);
  apcStack_2a88[0] = (code *)0x13185e;
  pvVar10 = (void *)bson_get_data(acStack_2a00);
  apcStack_2a88[0] = (code *)0x13186c;
  iVar2 = bcmp(pcVar22,pvVar10,(ulong)*(uint *)(pcVar8 + 4));
  if (iVar2 != 0) goto LAB_001318b1;
  apcStack_2a88[0] = (code *)0x13187b;
  bson_destroy(acStack_2a00);
  pvVar11 = (void *)((long)pvVar11 + 0x10);
  pcVar6 = acStack_2a00;
  pvVar10 = pvVar12;
  if (pvVar11 == (void *)0x40) {
    lVar7 = 8;
    do {
      apcStack_2a88[0] = (code *)0x131898;
      bson_destroy(*(undefined8 *)((long)&pcStack_2a40 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x48);
    return;
  }
  goto LAB_001317fb;
  while( true ) {
    if (*(char *)((long)pvStack_2a50 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_29fc == (uint)uVar23) break;
LAB_001318fb:
    if (*(int *)(pcVar8 + 4) == (int)uVar23) break;
  }
LAB_00131915:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_29fc;
    if (uStack_29fc < *(uint *)(pcVar8 + 4)) {
      uVar3 = *(uint *)(pcVar8 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_2a88[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar22,uVar5);
  apcStack_2a88[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar6 = (char *)(ulong)uVar3;
  apcStack_2a88[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2a50 = (void *)CONCAT44(pvStack_2a50._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_2a88[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_2a88[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_2a88[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar22 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar6 = (char *)(ulong)uStack_29fc;
    apcStack_2a88[0] = (code *)0x1319a2;
    pcVar26 = (char *)write(uVar3,pvVar10,(size_t)pcVar6);
    if (pcVar26 != pcVar6) goto LAB_001319d3;
    pcVar8 = (char *)(ulong)*(uint *)(pcVar8 + 4);
    apcStack_2a88[0] = (code *)0x1319b8;
    pcVar26 = (char *)write(uVar4,pvVar12,(size_t)pcVar8);
    if (pcVar26 == pcVar8) {
      apcStack_2a88[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_2a88[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_2a88[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_2e88[0] = (code *)0x131a07;
  pcStack_2ab0 = pcVar8;
  pcStack_2aa8 = pcVar6;
  pcStack_2aa0 = pcVar22;
  pcStack_2a98 = (char *)pvVar12;
  pcStack_2a90 = (char *)pvVar10;
  apcStack_2a88[0] = (code *)&pcStack_2688;
  uVar5 = bson_bcon_magic();
  apcStack_2e88[0] = (code *)0x131a29;
  pvStack_2e78 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_2e88[0] = (code *)0x131a4d;
  pvVar10 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  apcStack_2e88[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  apcStack_2e88[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  apcStack_2e88[0] = (code *)0x131aaf;
  uVar9 = bcon_new(0,"",uVar5,0,"",0);
  apcStack_2e88[0] = (code *)0x131ad1;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  apcStack_2e88[0] = (code *)0x131ad9;
  uStack_2e08 = bson_new();
  pcStack_2e70 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2e68 = pvStack_2e78;
  pcStack_2e60 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2e50 = "{ \"quote\": \"\\\"\"}";
  pcStack_2e40 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2e30 = "{ \"\": \"\"}";
  pcStack_2e20 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2e10 = "{ \"nil\": \"\\u0000\"}";
  apcStack_2e88[0] = (code *)0x131b76;
  pvStack_2e58 = pvVar10;
  puStack_2e48 = __n;
  puStack_2e38 = __s1;
  uStack_2e28 = uVar9;
  uStack_2e18 = uVar5;
  bson_append_utf8(uStack_2e08,"nil",0xffffffff,"",1);
  pvVar11 = (void *)0x8;
  while( true ) {
    apcStack_2e88[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_2e00,*(undefined8 *)((long)&pvStack_2e78 + (long)pvVar11),
                                0xffffffffffffffff,auStack_2d38);
    puVar14 = auStack_2e00;
    pvVar12 = pvVar11;
    if (cVar1 == '\0') break;
    apcStack_2e88[0] = (code *)0x131bb3;
    pvStack_2e78 = (void *)bson_get_data(auStack_2e00);
    puVar14 = *(undefined1 **)((long)&pcStack_2e70 + (long)pvVar11);
    apcStack_2e88[0] = (code *)0x131bc5;
    pvVar12 = (void *)bson_get_data(puVar14);
    if (*(uint *)(puVar14 + 4) != uStack_2dfc) {
LAB_00131c3a:
      apcStack_2e88[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_2e00);
      apcStack_2e88[0] = (code *)0x131c59;
      uVar5 = bson_as_canonical_extended_json(puVar14);
      pvVar10 = pvStack_2e78;
      uVar20 = 0xffffffff;
      if (uStack_2dfc == 0) goto LAB_00131c9e;
      uVar23 = 0;
      goto LAB_00131c84;
    }
    apcStack_2e88[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar14);
    apcStack_2e88[0] = (code *)0x131be7;
    pvVar10 = (void *)bson_get_data(auStack_2e00);
    apcStack_2e88[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar10,(ulong)*(uint *)(puVar14 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_2e88[0] = (code *)0x131c04;
    bson_destroy(auStack_2e00);
    pvVar11 = (void *)((long)pvVar11 + 0x10);
    __n = auStack_2e00;
    pvVar10 = pvVar12;
    if (pvVar11 == (void *)0x78) {
      lVar7 = 8;
      do {
        apcStack_2e88[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_2e70 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)pvStack_2e78 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_2dfc == (uint)uVar23) break;
LAB_00131c84:
    if (*(int *)(puVar14 + 4) == (int)uVar23) break;
  }
LAB_00131c9e:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_2dfc;
    if (uStack_2dfc < *(uint *)(puVar14 + 4)) {
      uVar3 = *(uint *)(puVar14 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_2e88[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__s1,uVar5);
  apcStack_2e88[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_2e88[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2e78 = (void *)CONCAT44(pvStack_2e78._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_2e88[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_2e88[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_2e88[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_2dfc;
    apcStack_2e88[0] = (code *)0x131d2b;
    puVar13 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar13 != __n) goto LAB_00131d5c;
    puVar14 = (undefined1 *)(ulong)*(uint *)(puVar14 + 4);
    apcStack_2e88[0] = (code *)0x131d41;
    puVar13 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar14);
    if (puVar13 == puVar14) {
      apcStack_2e88[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_2e88[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_2e88[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_3288[0] = (code *)0x131d90;
  puStack_2eb0 = puVar14;
  puStack_2ea8 = __n;
  puStack_2ea0 = __s1;
  pvStack_2e98 = pvVar12;
  pvStack_2e90 = pvVar10;
  apcStack_2e88[0] = (code *)apcStack_2a88;
  uVar5 = bson_bcon_magic();
  apcStack_3288[0] = (code *)0x131daf;
  pcVar6 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_3288[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_3200,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_3138);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_3288[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_3288[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_3288[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_3288[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_3288[0] = (code *)0x131ded;
    pvVar10 = (void *)bson_get_data(auStack_3200);
    apcStack_3288[0] = (code *)0x131df8;
    pvVar12 = (void *)bson_get_data(pcVar6);
    if (*(uint *)(pcVar6 + 4) == uStack_31fc) {
      apcStack_3288[0] = (code *)0x131e0d;
      pvVar11 = (void *)bson_get_data(pcVar6);
      apcStack_3288[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_3200);
      apcStack_3288[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar11,__s2,(ulong)*(uint *)(pcVar6 + 4));
      if (iVar2 == 0) {
        apcStack_3288[0] = (code *)0x131e3c;
        bson_destroy(auStack_3200);
        apcStack_3288[0] = (code *)0x131e44;
        bson_destroy(pcVar6);
        return;
      }
    }
    __s1 = auStack_3200;
    apcStack_3288[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(__s1);
    apcStack_3288[0] = (code *)0x131e72;
    uVar9 = bson_as_canonical_extended_json(pcVar6);
    uVar20 = 0xffffffff;
    if (uStack_31fc != 0) {
      uVar23 = 0;
      do {
        if (*(int *)(pcVar6 + 4) == (int)uVar23) break;
        if (*(char *)((long)pvVar10 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
          uVar20 = uVar23 & 0xffffffff;
          break;
        }
        uVar23 = uVar23 + 1;
      } while (uStack_31fc != (uint)uVar23);
    }
    if ((int)uVar20 == -1) {
      uVar3 = uStack_31fc;
      if (uStack_31fc < *(uint *)(pcVar6 + 4)) {
        uVar3 = *(uint *)(pcVar6 + 4);
      }
      uVar20 = (ulong)(uVar3 - 1);
    }
    apcStack_3288[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar5,uVar9);
    apcStack_3288[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_3288[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_3204 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_31fc;
    apcStack_3288[0] = (code *)0x131f2a;
    puVar14 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar14 != __n) goto LAB_00131f60;
    pcVar6 = (char *)(ulong)*(uint *)(pcVar6 + 4);
    apcStack_3288[0] = (code *)0x131f40;
    pcVar22 = (char *)write(uVar4,pvVar12,(size_t)pcVar6);
    if (pcVar22 == pcVar6) {
      apcStack_3288[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_3288[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_3608 = (code *)0x131f98;
  pcStack_3290 = pcVar6;
  apcStack_3288[0] = (code *)apcStack_2e88;
  cVar1 = bson_init_from_json(auStack_3600,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_3518);
  if (cVar1 == '\0') {
    if (iStack_3518 != 1) goto LAB_00131fe4;
    if (iStack_3514 != 1) goto LAB_00131fe9;
    pcVar6 = acStack_3510;
    pcStack_3608 = (code *)0x131fcb;
    pcVar22 = strstr(pcVar6,"UESCAPE_TOOSHORT");
    if (pcVar22 != (char *)0x0) {
      pcStack_3608 = (code *)0x131fd8;
      bson_destroy(auStack_3600);
      return;
    }
  }
  else {
    pcStack_3608 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_3608 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_3608 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_3608 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3a08 = (code *)0x132029;
  pcStack_3610 = pcVar6;
  pcStack_3608 = (code *)apcStack_3288;
  cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3898);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_3a08 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_3a08 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_3a08 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3a08 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') {
      pcStack_3a08 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_3a08 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_3a08 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_3a08 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_3a08 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_3a08 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_3a08 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_3a08 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_3a08 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_3a08 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_3a00);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar6 = acStack_3980;
    pcStack_3a08 = (code *)0x132084;
    bson_destroy(pcVar6);
    pcStack_3a08 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_3a08 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_3a08 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_3a08 = (code *)0x1320e2;
    bson_iter_int32(auStack_3a00);
  }
  pcStack_3a08 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_3a08 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_3a08 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_3a08 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_3a08 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3e08 = (code *)0x1322a4;
  pcStack_3a18 = pcVar6;
  pvStack_3a10 = pvVar12;
  pcStack_3a08 = (code *)&pcStack_3608;
  cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_3ca0);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_3e08 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_3e08 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_3e08 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_3e08 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_3e08 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_3e08 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_3e08 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_3e08 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_3e08 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_3e08 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_3e08 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_3e08 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_3e08 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_3e08 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_3e08 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3e08 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') {
      pcStack_3e08 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_3e08 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_3e08 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_3e08 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_3e08 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_3e08 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_3e08 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_3e08 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_3e08 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_3e08 = (code *)0x1322ee;
    lVar7 = bson_iter_int64(auStack_3e00);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar6 = acStack_3d80;
    pcStack_3e08 = (code *)0x132307;
    bson_destroy(pcVar6);
    pcStack_3e08 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_3e08 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_3e08 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_3e08 = (code *)0x132365;
    lVar7 = bson_iter_int64(auStack_3e00);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_0013255f;
    pcVar6 = acStack_3d80;
    pcStack_3e08 = (code *)0x132381;
    bson_destroy(pcVar6);
    pcStack_3e08 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_3ca0 != 1) goto LAB_00132567;
    if (iStack_3c9c != 2) goto LAB_0013256c;
    pcVar6 = acStack_3c98;
    pcStack_3e08 = (code *)0x1323de;
    pcVar22 = strstr(pcVar6,"Number \"9223372036854775808\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132571;
    pcStack_3e08 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_3ca0 != 1) goto LAB_00132579;
    if (iStack_3c9c != 2) goto LAB_0013257e;
    pcStack_3e08 = (code *)0x132441;
    pcVar22 = strstr(pcVar6,"Number \"-9223372036854775809\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132583;
    pcStack_3e08 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_3ca0 != 1) goto LAB_0013258b;
    if (iStack_3c9c != 2) goto LAB_00132590;
    pcStack_3e08 = (code *)0x1324a4;
    pcVar22 = strstr(pcVar6,"Number \"10000000000000000000\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132595;
    pcStack_3e08 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_3ca0 != 1) goto LAB_0013259d;
    if (iStack_3c9c != 2) goto LAB_001325a2;
    pcStack_3e08 = (code *)0x132503;
    pcVar22 = strstr(pcVar6,"Number \"-10000000000000000000\" is out of range");
    if (pcVar22 != (char *)0x0) {
      return;
    }
  }
  pcStack_3e08 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_4208 = (code *)0x1325e2;
  pcStack_3e10 = pcVar6;
  pcStack_3e08 = (code *)&pcStack_3a08;
  cVar1 = bson_init_from_json(acStack_4180,"{ \"x\": 1 }",0xffffffffffffffff,auStack_4098);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_4208 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_4208 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_4208 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_4208 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_4208 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_4208 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_4208 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_4208 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_4208 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_4208 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') {
      pcStack_4208 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_4208 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_4208 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_4208 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_4208 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_4208 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_4208 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_4208 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_4208 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_4208 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_4208 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_4208 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_4208 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_4200);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x13263b;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_4208 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_4208 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_4208 = (code *)0x132699;
    lVar7 = bson_iter_int64(auStack_4200);
    if (lVar7 != 0x100000000) goto LAB_001328a9;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x1326bc;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_4208 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_4208 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_4208 = (code *)0x13271a;
    dVar30 = (double)bson_iter_double(auStack_4200);
    if ((dVar30 != 1.0) || (NAN(dVar30))) goto LAB_001328be;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x13273e;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_4208 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_4208 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_4208 = (code *)0x13279c;
    dVar30 = (double)bson_iter_double(auStack_4200);
    if ((dVar30 != 0.0) || (NAN(dVar30))) goto LAB_001328d3;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x1327c0;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_4208 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_4208 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_4208 = (code *)0x132816;
    dVar30 = (double)bson_iter_double(auStack_4200);
    if ((dVar30 == 0.0) && (!NAN(dVar30))) {
      pcStack_4208 = (code *)0x132832;
      bson_iter_double(auStack_4200);
      if (extraout_XMM0_Db < 0) {
        pcStack_4208 = (code *)0x132849;
        bson_destroy(acStack_4180);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_4208 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar22 = "2e400";
  ppuVar25 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_4230 = pcVar6;
  puStack_4228 = __n;
  puStack_4220 = __s1;
  pvStack_4218 = pvVar12;
  pvStack_4210 = pvVar10;
  pcStack_4208 = (code *)&pcStack_3e08;
  while( true ) {
    pcStack_4588 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar22);
    pcStack_4588 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_4380,uVar5,0xffffffffffffffff,&iStack_4580);
    if (cVar1 != '\0') break;
    if (iStack_4580 != 1) goto LAB_00132a15;
    if (iStack_457c != 2) goto LAB_00132a10;
    pcStack_4588 = (code *)0x132979;
    pcVar6 = strstr(acStack_4578,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00132a1a;
    pcStack_4588 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_4588 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar22);
    pcStack_4588 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_4380,uVar5,0xffffffffffffffff,&iStack_4580);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_4580 != 1) goto LAB_00132a29;
    if (iStack_457c != 2) goto LAB_00132a24;
    pcStack_4588 = (code *)0x1329da;
    pcVar6 = strstr(acStack_4578,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00132a2e;
    pcStack_4588 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
  pcStack_4588 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_4588 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_4588 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_4588 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_4588 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_4588 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_4588 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_4588 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_45a0 = "out of range";
  pcVar8 = "{ \"d\": NaN }";
  ppuVar28 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar21 = aiStack_4900;
  piVar15 = &iStack_4838;
  piVar29 = (int *)0x14a6f6;
  pcVar6 = (char *)&dStack_4908;
  uStack_45b0 = uVar5;
  puStack_45a8 = (undefined1 *)&iStack_4580;
  pcStack_4598 = pcVar22;
  ppuStack_4590 = ppuVar25;
  pcStack_4588 = (code *)&pcStack_4208;
  do {
    apcStack_4988[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar21,pcVar8,0xffffffffffffffff,piVar15);
    if (cVar1 == '\0') {
      apcStack_4988[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_4988[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_4988[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_4988[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_4988[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar21,"d",uVar5,1,pcVar6,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_4908) && !NAN(dStack_4908)) goto LAB_00132bfa;
    apcStack_4988[0] = (code *)0x132ad4;
    bson_destroy(piVar21);
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar22 = "{ \"d\": NaNn }";
  ppuVar28 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar21 = aiStack_4830;
  piVar15 = aiStack_4900;
  piVar29 = &iStack_4838;
  pcVar6 = "Got parse error at";
  do {
    apcStack_4988[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_4838 != 1) goto LAB_00132c16;
    if (iStack_4834 != 1) goto LAB_00132c09;
    apcStack_4988[0] = (code *)0x132b53;
    pcVar22 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132c0e;
    pcVar22 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": nu";
  ppuVar28 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar21 = aiStack_4830;
  piVar15 = aiStack_4900;
  piVar29 = &iStack_4838;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_4988[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_4838 != 1) goto LAB_00132c28;
    if (iStack_4834 != 1) goto LAB_00132c1b;
    apcStack_4988[0] = (code *)0x132bcf;
    pcVar22 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132c20;
    pcVar22 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_4988[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_4988[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_4988[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_4988[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_4988[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_4988[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_4988[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar22 = "{ \"d\": Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_49b0 = piVar21;
  pdStack_49a8 = (double *)pcVar6;
  ppuStack_49a0 = ppuVar28;
  piStack_4998 = piVar15;
  piStack_4990 = piVar29;
  apcStack_4988[0] = (code *)&pcStack_4588;
  do {
    apcStack_4d88[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_4d00,pcVar22,0xffffffffffffffff,&iStack_4c38);
    if (cVar1 == '\0') {
      apcStack_4d88[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_4d88[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_4d88[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_4d88[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_4d88[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_4d00,"d",uVar5,1,&dStack_4d08,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_4d08)) || (!NAN(dStack_4d08 - dStack_4d08) && !NAN(dStack_4d08 - dStack_4d08)))
    goto LAB_00132eb6;
    apcStack_4d88[0] = (code *)0x132cd7;
    bson_destroy(aiStack_4d00);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar6 = "{ \"d\": -Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_4d88[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_4d00,pcVar6,0xffffffffffffffff,&iStack_4c38);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_4d88[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_4d88[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_4d00,"d",uVar5,1,&dStack_4d08,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_4d08)) || (!NAN(dStack_4d08 - dStack_4d08))) goto LAB_00132ec5;
    if (0.0 <= dStack_4d08) goto LAB_00132eca;
    apcStack_4d88[0] = (code *)0x132d88;
    bson_destroy(aiStack_4d00);
    pcVar6 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar6 != (char *)0x0);
  pcVar22 = "{ \"d\": Infinityy }";
  ppuVar25 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar21 = aiStack_4c30;
  piVar15 = aiStack_4d00;
  piVar29 = &iStack_4c38;
  pcVar6 = "Got parse error at";
  do {
    apcStack_4d88[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_4c38 != 1) goto LAB_00132ee6;
    if (iStack_4c34 != 1) goto LAB_00132ed9;
    apcStack_4d88[0] = (code *)0x132e0b;
    pcVar22 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132ede;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": In";
  ppuVar25 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar21 = aiStack_4c30;
  piVar15 = aiStack_4d00;
  piVar29 = &iStack_4c38;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_4d88[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_4c38 != 1) goto LAB_00132ef8;
    if (iStack_4c34 != 1) goto LAB_00132eeb;
    apcStack_4d88[0] = (code *)0x132e8b;
    pcVar22 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132ef0;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_4d88[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_4d88[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_4d88[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_4d88[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_4d88[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_4d88[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_4d88[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_5108 = (code *)0x132f2a;
  apcStack_4d88[0] = (code *)apcStack_4988;
  cVar1 = bson_init_from_json(auStack_5100,"{ \"x\": null }",0xffffffffffffffff,auStack_5010);
  if (cVar1 == '\0') {
    pcStack_5108 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_5108 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_5108 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_5100,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_5108 = (code *)0x132f5b;
      bson_destroy(auStack_5100);
      return;
    }
  }
  pcStack_5108 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_5508 = (code *)0x0;
  pcStack_5510 = "}";
  acStack_5520[8] = -0x52;
  acStack_5520[9] = '/';
  acStack_5520[10] = '\x13';
  acStack_5520[0xb] = '\0';
  acStack_5520[0xc] = '\0';
  acStack_5520[0xd] = '\0';
  acStack_5520[0xe] = '\0';
  acStack_5520[0xf] = '\0';
  piStack_5130 = piVar21;
  pdStack_5128 = (double *)pcVar6;
  ppuStack_5120 = ppuVar25;
  piStack_5118 = piVar15;
  piStack_5110 = piVar29;
  pcStack_5108 = (code *)apcStack_4d88;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_5410 = 0;
  uStack_5408 = 0;
  uStack_5420 = 0;
  uStack_5418 = 0;
  uStack_5430 = 0;
  uStack_5428 = 0;
  uStack_5440 = 0;
  uStack_5438 = 0;
  uStack_5450 = 0;
  uStack_5448 = 0;
  uStack_5460 = 0;
  uStack_5458 = 0;
  uStack_5470 = 0;
  uStack_5468 = 0;
  uStack_5480 = (undefined *)0x500000003;
  uStack_5478 = 5;
  pcStack_5508 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_5480,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_53b8);
  if (cVar1 != '\0') {
    pcStack_5508 = (code *)0x133023;
    piVar29 = (int *)bson_get_data(&uStack_5480);
    pcStack_5508 = (code *)0x13302e;
    piVar15 = (int *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_5480._4_4_) {
      pcStack_5508 = (code *)0x133043;
      pvVar10 = (void *)bson_get_data(uVar20);
      pcStack_5508 = (code *)0x133053;
      pvVar11 = (void *)bson_get_data(&uStack_5480);
      pcStack_5508 = (code *)0x133061;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_5508 = (code *)0x133072;
        bson_destroy(&uStack_5480);
        pcStack_5508 = (code *)0x13307a;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar25 = (undefined **)&uStack_5480;
    pcStack_5508 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar25);
    pcStack_5508 = (code *)0x1330a8;
    uVar9 = bson_as_canonical_extended_json(uVar20);
    uVar23 = 0xffffffff;
    if (uStack_5480._4_4_ != 0) {
      uVar24 = 0;
      do {
        if (*(int *)(uVar20 + 4) == (int)uVar24) break;
        if (*(char *)((long)piVar29 + uVar24) != *(char *)((long)piVar15 + uVar24)) {
          uVar23 = uVar24 & 0xffffffff;
          break;
        }
        uVar24 = uVar24 + 1;
      } while (uStack_5480._4_4_ != (uint)uVar24);
    }
    if ((int)uVar23 == -1) {
      uVar3 = uStack_5480._4_4_;
      if (uStack_5480._4_4_ < *(uint *)(uVar20 + 4)) {
        uVar3 = *(uint *)(uVar20 + 4);
      }
      uVar23 = (ulong)(uVar3 - 1);
    }
    pcStack_5508 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar23,uVar5,uVar9);
    pcStack_5508 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar6 = (char *)(ulong)uVar3;
    pcStack_5508 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_5484 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_5508 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_5508 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_5508 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar25 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar6 = (char *)((ulong)uStack_5480 >> 0x20);
      pcStack_5508 = (code *)0x133160;
      pdVar16 = (double *)write(uVar3,piVar29,(size_t)pcVar6);
      if (pdVar16 != (double *)pcVar6) goto LAB_00133191;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_5508 = (code *)0x133176;
      uVar23 = write(uVar4,piVar15,uVar20);
      if (uVar23 == uVar20) {
        pcStack_5508 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_5508 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_5508 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar22 = acStack_5520;
  acStack_5520[8] = '\0';
  acStack_5520[9] = '\0';
  acStack_5520[10] = '\0';
  acStack_5520[0xb] = '\0';
  acStack_5520[0xc] = '\0';
  acStack_5520[0xd] = '\0';
  acStack_5520[0xe] = '@';
  acStack_5520[0xf] = '0';
  acStack_5520[0] = '\v';
  acStack_5520[1] = '\0';
  acStack_5520[2] = '\0';
  acStack_5520[3] = '\0';
  acStack_5520[4] = '\0';
  acStack_5520[5] = '\0';
  acStack_5520[6] = '\0';
  acStack_5520[7] = '\0';
  pcStack_5530 = (code *)0x1331ce;
  pcStack_5510 = (char *)uVar20;
  pcStack_5508 = (code *)piVar15;
  plVar17 = (long *)bson_new();
  pcStack_5530 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar17,"decimal128",0xffffffff,pcVar22);
  if (cVar1 == '\0') {
    pcStack_5530 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_5530 = (code *)0x1331f7;
    pcVar22 = (char *)bson_as_json(plVar17,auStack_5528);
    if (pcVar22 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_5530 = (code *)0x133221;
      bson_free(pcVar22);
      pcStack_5530 = (code *)0x133229;
      bson_destroy(plVar17);
      return;
    }
    pcStack_5530 = (code *)0x133215;
    iVar2 = strcmp(pcVar22,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_5530 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar31 = &pcStack_5530;
  pcStack_5988 = (code *)0x133271;
  plStack_5538 = plVar17;
  pcStack_5530 = (code *)&pcStack_5108;
  cVar1 = bson_init_from_json(auStack_5880,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_5798);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_5988 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_5900,auStack_5880);
  if (cVar1 == '\0') {
    pcStack_5988 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_5988 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_5988 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_5988 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_5988 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_5900,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_5988 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_5900);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar17 = &lStack_5910;
    pcStack_5988 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_5900,plVar17);
    if (lStack_5910 != 0xb) goto LAB_0013330b;
    if (lStack_5908 == 0x3040000000000000) {
      pcStack_5988 = (code *)0x1332f5;
      bson_destroy(auStack_5880);
      return;
    }
  }
  pcStack_5988 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_5988 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar8 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar28 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_59a0 = plVar17;
  pdStack_5998 = (double *)pcVar6;
  pcStack_5990 = pcVar22;
  pcStack_5988 = (code *)piVar29;
  do {
    pcStack_5bb0 = (code *)0x133357;
    lVar7 = bson_new_from_json(pcVar8,0xffffffffffffffff,&iStack_5ba0);
    if (lVar7 != 0) {
      pcStack_5bb0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_5bb0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5b98,
              piVar29);
      pcStack_5bb0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_5ba0 != 1) {
LAB_001333cc:
      pcStack_5bb0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_5dc8 = (code *)0x1333f1;
      pcStack_5bb8 = acStack_5b98;
      pcStack_5bb0 = (code *)&iStack_5ba0;
      pcVar6 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_5db8);
      pcStack_5dc8 = (code *)0x1333fe;
      pcVar22 = (char *)bson_as_json(pcVar6,0);
      if (pcVar22 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_5dc8 = (code *)0x133428;
        bson_free(pcVar22);
        pcStack_5dc8 = (code *)0x133430;
        bson_destroy(pcVar6);
        return;
      }
      pcStack_5dc8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar22,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_5dc8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_5fd8 = 0x2200223a2261227b;
      uStack_5fd0 = 0x7d;
      uStack_5fdc = 0x227b;
      pcStack_5dc8 = (code *)pcVar6;
      lVar7 = bson_new_from_json(&uStack_5fd8,9,&iStack_5fc8);
      if (lVar7 == 0) {
        if (iStack_5fc8 != 1) goto LAB_001334fc;
        if (iStack_5fc4 != 1) goto LAB_00133501;
        pcVar6 = acStack_5fc0;
        pcVar8 = strstr(pcVar6,"Got parse error");
        if (pcVar8 == (char *)0x0) goto LAB_00133506;
        lVar7 = bson_new_from_json(&uStack_5fdc,3,&iStack_5fc8);
        if (lVar7 != 0) goto LAB_001334f7;
        if (iStack_5fc8 != 1) goto LAB_0013350e;
        if (iStack_5fc4 == 1) {
          pcVar8 = strstr(pcVar6,"Got parse error");
          if (pcVar8 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0,uVar5,pcVar6,ppuVar28,ppuVar25,pcVar22,piVar29,ppcVar31);
      uVar18 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar18,0);
      uVar5 = bson_new();
      uVar18 = bson_new();
      uVar19 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar18,uVar19,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_5b9c != 2) {
      pcStack_5bb0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar29 = (int *)ppuVar28[-1];
    pcStack_5bb0 = (code *)0x13337e;
    pcVar6 = strstr(acStack_5b98,(char *)piVar29);
    if (pcVar6 == (char *)0x0) goto LAB_001333a4;
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 2;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_4988[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_4d88[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_4d88[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_4d88[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar15 = &iStack_4c38;
  pcVar6 = (char *)&dStack_4d08;
  piVar21 = aiStack_4d00;
  piVar29 = (int *)0x14a6f6;
  apcStack_4d88[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_4d88[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_read_legacy_regex (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (pattern, "abc");
   ASSERT_CMPSTR (flags, "ix");

   bson_destroy (&b);

   r = bson_init_from_json (&b, "{\"a\": {\"$regex\": \"abc\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$options\" after \"$regex\"");

   r = bson_init_from_json (&b, "{\"a\": {\"$options\": \"ix\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$regex\" after \"$options\"");
}